

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O1

void WindowDropCallback(GLFWwindow *window,int count,char **paths)

{
  char *pcVar1;
  uint i;
  ulong uVar2;
  
  if (0 < count) {
    if (CORE.Window.dropFileCount != 0) {
      if (CORE.Window.dropFileCount != 0) {
        uVar2 = 0;
        do {
          free(CORE.Window.dropFilepaths[uVar2]);
          uVar2 = uVar2 + 1;
        } while (uVar2 < CORE.Window.dropFileCount);
      }
      free(CORE.Window.dropFilepaths);
      CORE.Window.dropFilepaths = (char **)0x0;
    }
    CORE.Window.dropFileCount = count;
    CORE.Window.dropFilepaths = (char **)calloc((ulong)(uint)count,8);
    uVar2 = 0;
    do {
      pcVar1 = (char *)calloc(0x1000,1);
      CORE.Window.dropFilepaths[uVar2] = pcVar1;
      strcpy(CORE.Window.dropFilepaths[uVar2],paths[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < CORE.Window.dropFileCount);
  }
  return;
}

Assistant:

static void WindowDropCallback(GLFWwindow *window, int count, const char **paths)
{
    if (count > 0)
    {
        // In case previous dropped filepaths have not been freed, we free them
        if (CORE.Window.dropFileCount > 0)
        {
            for (unsigned int i = 0; i < CORE.Window.dropFileCount; i++) RL_FREE(CORE.Window.dropFilepaths[i]);

            RL_FREE(CORE.Window.dropFilepaths);

            CORE.Window.dropFileCount = 0;
            CORE.Window.dropFilepaths = NULL;
        }

        // WARNING: Paths are freed by GLFW when the callback returns, we must keep an internal copy
        CORE.Window.dropFileCount = count;
        CORE.Window.dropFilepaths = (char **)RL_CALLOC(CORE.Window.dropFileCount, sizeof(char *));

        for (unsigned int i = 0; i < CORE.Window.dropFileCount; i++)
        {
            CORE.Window.dropFilepaths[i] = (char *)RL_CALLOC(MAX_FILEPATH_LENGTH, sizeof(char));
            strcpy(CORE.Window.dropFilepaths[i], paths[i]);
        }
    }
}